

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrMan.c
# Opt level: O3

Rwr_Man_t * Rwr_ManStart(int fPrecompute)

{
  uchar *puVar1;
  int iVar2;
  Rwr_Man_t *p;
  void *pvVar3;
  char *pcVar4;
  Rwr_Node_t **ppRVar5;
  Extra_MmFixed_t *pEVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  char **ppcVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  timespec ts;
  timespec local_38;
  
  clock_gettime(3,&local_38);
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p = (Rwr_Man_t *)calloc(1,0x470);
  p->nFuncs = 0x10000;
  pvVar3 = Abc_FrameReadManDec();
  pcVar4 = *(char **)((long)pvVar3 + 0x20);
  p->puCanons = *(unsigned_short **)((long)pvVar3 + 0x18);
  p->pPhases = pcVar4;
  puVar1 = *(uchar **)((long)pvVar3 + 0x30);
  p->pPerms = *(char **)((long)pvVar3 + 0x28);
  p->pMap = puVar1;
  pcVar4 = Rwr_ManGetPractical(p);
  p->pPractical = pcVar4;
  ppRVar5 = (Rwr_Node_t **)calloc(1,(long)p->nFuncs << 3);
  p->pTable = ppRVar5;
  pEVar6 = Extra_MmFixedStart(0x30);
  p->pMmNode = pEVar6;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(800);
  pVVar7->pArray = ppvVar8;
  p->vForest = pVVar7;
  Rwr_ManAddVar(p,0,fPrecompute);
  Rwr_ManAddVar(p,0xaaaa,fPrecompute);
  Rwr_ManAddVar(p,0xcccc,fPrecompute);
  Rwr_ManAddVar(p,0xf0f0,fPrecompute);
  Rwr_ManAddVar(p,0xff00,fPrecompute);
  p->nClasses = 5;
  p->nTravIds = 1;
  ppcVar9 = Extra_Permutations(4);
  p->pPerms4 = ppcVar9;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 0x32;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(200);
  pVVar10->pArray = piVar11;
  p->vLevNums = pVVar10;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 0x32;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(400);
  pVVar7->pArray = ppvVar8;
  p->vFanins = pVVar7;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 0x32;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(400);
  pVVar7->pArray = ppvVar8;
  p->vFaninsCur = pVVar7;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 0x32;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(400);
  pVVar7->pArray = ppvVar8;
  p->vNodesTemp = pVVar7;
  if (fPrecompute == 0) {
    Rwr_ManLoadFromArray(p,0);
    Rwr_ManPreprocess(p);
  }
  else {
    Rwr_ManPrecompute(p);
    Rwr_ManWriteToArray(p);
  }
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeStart = lVar13 + lVar12;
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts rewriting manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Rwr_Man_t * Rwr_ManStart( int  fPrecompute )
{
    Dec_Man_t * pManDec;
    Rwr_Man_t * p;
    abctime clk = Abc_Clock();
clk = Abc_Clock();
    p = ABC_ALLOC( Rwr_Man_t, 1 );
    memset( p, 0, sizeof(Rwr_Man_t) );
    p->nFuncs = (1<<16);
    pManDec   = (Dec_Man_t *)Abc_FrameReadManDec();
    p->puCanons = pManDec->puCanons; 
    p->pPhases  = pManDec->pPhases; 
    p->pPerms   = pManDec->pPerms; 
    p->pMap     = pManDec->pMap; 
    // initialize practical NPN classes
    p->pPractical  = Rwr_ManGetPractical( p );
    // create the table
    p->pTable = ABC_ALLOC( Rwr_Node_t *, p->nFuncs );
    memset( p->pTable, 0, sizeof(Rwr_Node_t *) * p->nFuncs );
    // create the elementary nodes
    p->pMmNode  = Extra_MmFixedStart( sizeof(Rwr_Node_t) );
    p->vForest  = Vec_PtrAlloc( 100 );
    Rwr_ManAddVar( p, 0x0000, fPrecompute ); // constant 0
    Rwr_ManAddVar( p, 0xAAAA, fPrecompute ); // var A
    Rwr_ManAddVar( p, 0xCCCC, fPrecompute ); // var B
    Rwr_ManAddVar( p, 0xF0F0, fPrecompute ); // var C
    Rwr_ManAddVar( p, 0xFF00, fPrecompute ); // var D
    p->nClasses = 5;
    // other stuff
    p->nTravIds   = 1;
    p->pPerms4    = Extra_Permutations( 4 );
    p->vLevNums   = Vec_IntAlloc( 50 );
    p->vFanins    = Vec_PtrAlloc( 50 );
    p->vFaninsCur = Vec_PtrAlloc( 50 );
    p->vNodesTemp = Vec_PtrAlloc( 50 );
    if ( fPrecompute )
    {   // precompute subgraphs
        Rwr_ManPrecompute( p );
//        Rwr_ManPrint( p );
        Rwr_ManWriteToArray( p );
    }
    else
    {   // load saved subgraphs
        Rwr_ManLoadFromArray( p, 0 );
//        Rwr_ManPrint( p );
        Rwr_ManPreprocess( p );
    }
p->timeStart = Abc_Clock() - clk;
    return p;
}